

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O3

void Eigen::internal::
     call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,__1,_1,_0,__1,_1> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>_>
               *src,assign_op<float,_float> *func,type param_4)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  undefined8 uVar4;
  float *pfVar5;
  Index IVar6;
  ulong uVar7;
  long lVar8;
  Index size;
  type tmp;
  assign_op<float,_float> local_29;
  Matrix<float,__1,_1,_0,__1,_1> local_28;
  
  local_28.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (float *)0x0;
  local_28.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  assignment_from_xpr_op_product<Eigen::Matrix<float,-1,1,0,-1,1>,Eigen::Matrix<float,-1,1,0,-1,1>,Eigen::Product<Eigen::Matrix<float,-1,-1,0,-1,-1>,Eigen::Matrix<float,-1,1,0,-1,1>,0>,Eigen::internal::assign_op<float,float>,Eigen::internal::sub_assign_op<float,float>>
  ::
  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<float,float>>
            (&local_28,src,&local_29);
  IVar6 = local_28.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  pfVar5 = local_28.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if ((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      local_28.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    if (local_28.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, 1>]"
                   );
    }
    DenseStorage<float,_-1,_-1,_1,_0>::resize
              ((DenseStorage<float,__1,__1,_1,_0> *)dst,
               local_28.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows,local_28.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows,1);
    if ((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        IVar6) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                    ,0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::Matrix<float, -1, 1>, T1 = float, T2 = float]"
                   );
    }
  }
  pfVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar7 = IVar6 + 3;
  if (-1 < IVar6) {
    uVar7 = IVar6;
  }
  uVar7 = uVar7 & 0xfffffffffffffffc;
  if (3 < IVar6) {
    lVar8 = 0;
    do {
      pfVar1 = pfVar5 + lVar8;
      uVar4 = *(undefined8 *)(pfVar1 + 2);
      pfVar2 = pfVar3 + lVar8;
      *(undefined8 *)pfVar2 = *(undefined8 *)pfVar1;
      *(undefined8 *)(pfVar2 + 2) = uVar4;
      lVar8 = lVar8 + 4;
    } while (lVar8 < (long)uVar7);
  }
  if ((long)uVar7 < IVar6) {
    do {
      pfVar3[uVar7] = pfVar5[uVar7];
      uVar7 = uVar7 + 1;
    } while (IVar6 != uVar7);
  }
  free(local_28.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment(Dst& dst, const Src& src, const Func& func, typename enable_if< evaluator_assume_aliasing<Src>::value, void*>::type = 0)
{
  typename plain_matrix_type<Src>::type tmp(src);
  call_assignment_no_alias(dst, tmp, func);
}